

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

void xmlDumpElementOccur(xmlBufferPtr buf,xmlElementContentPtr cur)

{
  xmlElementContentPtr cur_local;
  xmlBufferPtr buf_local;
  
  switch(cur->ocur) {
  case XML_ELEMENT_CONTENT_ONCE:
    break;
  case XML_ELEMENT_CONTENT_OPT:
    xmlBufferWriteChar(buf,"?");
    break;
  case XML_ELEMENT_CONTENT_MULT:
    xmlBufferWriteChar(buf,"*");
    break;
  case XML_ELEMENT_CONTENT_PLUS:
    xmlBufferWriteChar(buf,"+");
  }
  return;
}

Assistant:

static void
xmlDumpElementOccur(xmlBufferPtr buf, xmlElementContentPtr cur) {
    switch (cur->ocur) {
        case XML_ELEMENT_CONTENT_ONCE:
            break;
        case XML_ELEMENT_CONTENT_OPT:
            xmlBufferWriteChar(buf, "?");
            break;
        case XML_ELEMENT_CONTENT_MULT:
            xmlBufferWriteChar(buf, "*");
            break;
        case XML_ELEMENT_CONTENT_PLUS:
            xmlBufferWriteChar(buf, "+");
            break;
    }
}